

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsReadConstant(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pRange,int *pSigned,
                          int *pXValue)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint *p_00;
  word *pTruth;
  bool local_59;
  int Number;
  int nBits;
  int nDigits;
  int i;
  int *pXValue_local;
  int *pSigned_local;
  int *pRange_local;
  Vec_Int_t *vFanins_local;
  char *pStr_local;
  Wlc_Prs_t *p_local;
  
  iVar1 = atoi(pStr);
  *pRange = -1;
  *pSigned = 0;
  *pXValue = 0;
  vFanins_local = (Vec_Int_t *)Wlc_PrsSkipSpaces(pStr);
  pcVar3 = Wlc_PrsFindSymbol((char *)vFanins_local,'\'');
  if (pcVar3 == (char *)0x0) {
    iVar1 = atoi((char *)vFanins_local);
    iVar2 = Abc_Base2Log(iVar1 + 1);
    *pRange = iVar2;
    if (0x1f < *pRange) {
      __assert_fail("*pRange < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadVer.c"
                    ,0x24e,
                    "char *Wlc_PrsReadConstant(Wlc_Prs_t *, char *, Vec_Int_t *, int *, int *, int *)"
                   );
    }
    while (iVar2 = Wlc_PrsIsDigit((char *)vFanins_local), iVar2 != 0) {
      vFanins_local = (Vec_Int_t *)((long)&vFanins_local->nCap + 1);
    }
    Vec_IntFill(vFanins,1,iVar1);
    p_local = (Wlc_Prs_t *)vFanins_local;
  }
  else {
    vFanins_local = (Vec_Int_t *)Wlc_PrsFindSymbol((char *)vFanins_local,'\'');
    if (*(char *)((long)&vFanins_local->nCap + 1) == 's') {
      *pSigned = 1;
      vFanins_local = (Vec_Int_t *)((long)&vFanins_local->nCap + 1);
    }
    if (*(char *)((long)&vFanins_local->nCap + 1) == 'b') {
      iVar2 = Abc_BitWordNum(iVar1);
      Vec_IntFill(vFanins,iVar2,0);
      for (nBits = 0; nBits < iVar1; nBits = nBits + 1) {
        if (*(char *)((long)&vFanins_local->nCap + (long)(nBits + 2)) == '1') {
          p_00 = (uint *)Vec_IntArray(vFanins);
          Abc_InfoSetBit(p_00,(iVar1 + -1) - nBits);
        }
        else if (*(char *)((long)&vFanins_local->nCap + (long)(nBits + 2)) != '0') {
          iVar1 = Wlc_PrsWriteErrorMessage
                            (p,(char *)vFanins_local,"Wrong digit in binary constant \"%c\".",
                             (ulong)(uint)(int)*(char *)((long)&vFanins_local->nCap +
                                                        (long)(nBits + 2)));
          return (char *)(long)iVar1;
        }
      }
      *pRange = iVar1;
      p_local = (Wlc_Prs_t *)((long)&vFanins_local->nCap + (long)(iVar1 + 2));
    }
    else if (*(char *)((long)&vFanins_local->nCap + 1) == 'h') {
      local_59 = true;
      if (*(char *)((long)&vFanins_local->nCap + 2) != 'x') {
        local_59 = *(char *)((long)&vFanins_local->nCap + 2) == 'X';
      }
      *pXValue = (uint)local_59;
      if (*pXValue == 0x58) {
        *pXValue = 0x78;
      }
      iVar2 = Abc_BitWordNum(iVar1);
      Vec_IntFill(vFanins,iVar2,0);
      pTruth = (word *)Vec_IntArray(vFanins);
      Abc_TtReadHexNumber(pTruth,(char *)((long)&vFanins_local->nCap + 2));
      *pRange = iVar1;
      vFanins_local = (Vec_Int_t *)((long)&vFanins_local->nCap + 2);
      while (iVar1 = Wlc_PrsIsChar((char *)vFanins_local), iVar1 != 0) {
        vFanins_local = (Vec_Int_t *)((long)&vFanins_local->nCap + 1);
      }
      p_local = (Wlc_Prs_t *)vFanins_local;
    }
    else {
      iVar1 = Wlc_PrsWriteErrorMessage
                        (p,(char *)vFanins_local,"Expecting hexadecimal constant and not \"%c\".",
                         (ulong)(uint)(int)*(char *)((long)&vFanins_local->nCap + 1));
      p_local = (Wlc_Prs_t *)(long)iVar1;
    }
  }
  return (char *)p_local;
}

Assistant:

static inline char * Wlc_PrsReadConstant( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pRange, int * pSigned, int * pXValue )
{
    int i, nDigits, nBits = atoi( pStr );
    *pRange = -1;
    *pSigned = 0;
    *pXValue = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsFindSymbol( pStr, '\'' ) == NULL )
    {
        // handle decimal number
        int Number = atoi( pStr );
        *pRange = Abc_Base2Log( Number+1 );
        assert( *pRange < 32 );
        while ( Wlc_PrsIsDigit(pStr) )
            pStr++;
        Vec_IntFill( vFanins, 1, Number );
        return pStr;
    }
    pStr = Wlc_PrsFindSymbol( pStr, '\'' );
    if ( pStr[1] == 's' )
    {
        *pSigned = 1;
        pStr++;
    }
    if ( pStr[1] == 'b' )
    {
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
                return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Wrong digit in binary constant \"%c\".", pStr[2+i] );
        *pRange = nBits;
        pStr += 2 + nBits;
        return pStr;
    }
    if ( pStr[1] != 'h' )
        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Expecting hexadecimal constant and not \"%c\".", pStr[1] );
    *pXValue = (pStr[2] == 'x' || pStr[2] == 'X');
    if ( *pXValue == 'X' )
        *pXValue = 'x';
    Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
    nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
    if ( nDigits != (nBits + 3)/4 )
    {
//        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "The length of a constant does not match." );
//        printf( "Warning: The length of a constant (%d hex digits) does not match the number of bits (%d).\n", nDigits, nBits );
    }
    *pRange = nBits;
    pStr += 2;
    while ( Wlc_PrsIsChar(pStr) )
        pStr++;
    return pStr;
}